

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppjit.hpp
# Opt level: O0

void __thiscall
cppjit::kernel<void,_cppjit::detail::pack<>_>::operator()
          (kernel<void,_cppjit::detail::pack<>_> *this)

{
  bool bVar1;
  kernel<void,_cppjit::detail::pack<>_> *this_local;
  
  bVar1 = std::function::operator_cast_to_bool((function *)&this->kernel_implementation);
  if (!bVar1) {
    compile(this);
  }
  std::function<void_()>::operator()(&this->kernel_implementation);
  return;
}

Assistant:

R operator()(Args... args) {
    if (!kernel_implementation) {
      this->compile();
      // throw cppjit::cppjit_exception("kernel not compiled");
    }
    return kernel_implementation(std::forward<Args>(args)...);
  }